

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NgammaT.cpp
# Opt level: O0

void __thiscall OpenMD::NgammaT::scaleSimBox(NgammaT *this)

{
  double *pdVar1;
  SquareMatrix3<double> *m2;
  SquareMatrix3<double> *this_00;
  long in_RDI;
  double dVar2;
  Snapshot *this_01;
  Mat3x3d hmat;
  Mat3x3d scaleMat;
  SquareMatrix3<double> *m1;
  Mat3x3d *in_stack_ffffffffffffff38;
  Snapshot *in_stack_ffffffffffffff40;
  RectMatrix<double,_3U,_3U> local_50;
  
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x281489);
  dVar2 = *(double *)(in_RDI + 8);
  pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),*(uint *)(in_RDI + 0x334),
                      *(uint *)(in_RDI + 0x334));
  dVar2 = exp(dVar2 * *pdVar1);
  pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                     (&local_50,*(uint *)(in_RDI + 0x334),*(uint *)(in_RDI + 0x334));
  *pdVar1 = dVar2;
  m1 = *(SquareMatrix3<double> **)(in_RDI + 8);
  pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),*(uint *)(in_RDI + 0x338),
                      *(uint *)(in_RDI + 0x338));
  dVar2 = exp((double)m1 * *pdVar1);
  m2 = (SquareMatrix3<double> *)
       RectMatrix<double,_3U,_3U>::operator()
                 (&local_50,*(uint *)(in_RDI + 0x338),*(uint *)(in_RDI + 0x338));
  (m2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] = dVar2;
  dVar2 = *(double *)(in_RDI + 8);
  pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),*(uint *)(in_RDI + 0x330),
                      *(uint *)(in_RDI + 0x330));
  this_01 = (Snapshot *)exp(dVar2 * *pdVar1);
  this_00 = (SquareMatrix3<double> *)
            RectMatrix<double,_3U,_3U>::operator()
                      (&local_50,*(uint *)(in_RDI + 0x330),*(uint *)(in_RDI + 0x330));
  (this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       (double)this_01;
  Snapshot::getHmat(this_01);
  OpenMD::operator*(m1,m2);
  SquareMatrix3<double>::operator=(this_00,(SquareMatrix3<double> *)this_01);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x281650);
  Snapshot::setHmat(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x281678);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x281685);
  return;
}

Assistant:

void NgammaT::scaleSimBox() {
    Mat3x3d scaleMat;

    scaleMat(axis1_, axis1_) = exp(dt * eta(axis1_, axis1_));
    scaleMat(axis2_, axis2_) = exp(dt * eta(axis2_, axis2_));
    scaleMat(axis_, axis_)   = exp(dt * eta(axis_, axis_));
    Mat3x3d hmat             = snap->getHmat();
    hmat                     = hmat * scaleMat;
    snap->setHmat(hmat);
  }